

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O3

int LLVMFuzzerTestOneInput(uchar *data,size_t size)

{
  FuzzHelper f;
  FuzzHelper local_50;
  
  setenv("JSIMD_FORCENONE","1",1);
  FuzzHelper::FuzzHelper(&local_50,data,size);
  FuzzHelper::run(&local_50);
  Pl_Discard::~Pl_Discard(&local_50.discard);
  Buffer::~Buffer(&local_50.input_buffer);
  return 0;
}

Assistant:

int
LLVMFuzzerTestOneInput(unsigned char const* data, size_t size)
{
#ifndef _WIN32
    // Used by jpeg library to work around false positives in memory
    // sanitizer.
    setenv("JSIMD_FORCENONE", "1", 1);
#endif
    FuzzHelper f(data, size);
    f.run();
    return 0;
}